

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O1

void iutest::detail::PrintToFloatingPoint<long_double>
               (floating_point<long_double> *f,iu_ostream *os)

{
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  char cVar4;
  ostream *poVar5;
  size_t sVar6;
  ulong uVar7;
  char *pcVar8;
  char cVar9;
  uint uVar10;
  iu_stringstream ss;
  long *local_208;
  long local_200;
  long local_1f8 [2];
  long *local_1e8;
  long local_1e0;
  long local_1d8 [2];
  char local_1c8 [40];
  stringstream local_1a0 [16];
  long local_190;
  undefined8 local_188 [13];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  *(undefined8 *)((long)local_188 + *(long *)(local_190 + -0x18)) = 0x14;
  std::ostream::_M_insert<long_double>(*(longdouble *)&f->m_v);
  std::__cxx11::stringbuf::str();
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_1e8,local_1e0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(0x",3);
  uVar1 = *(ulong *)&f->m_v;
  uVar2 = *(ulong *)((long)&f->m_v + 8);
  pcVar8 = local_1c8;
  local_1c8[0x10] = '\0';
  local_1c8[0x11] = '\0';
  local_1c8[0x12] = '\0';
  local_1c8[0x13] = '\0';
  local_1c8[0x14] = '\0';
  local_1c8[0x15] = '\0';
  local_1c8[0x16] = '\0';
  local_1c8[0x17] = '\0';
  local_1c8[0x18] = '\0';
  local_1c8[0x19] = '\0';
  local_1c8[0x1a] = '\0';
  local_1c8[0x1b] = '\0';
  local_1c8[0x1c] = '\0';
  local_1c8[0x1d] = '\0';
  local_1c8[0x1e] = '\0';
  local_1c8[0x1f] = '\0';
  local_1c8[0] = '\0';
  local_1c8[1] = '\0';
  local_1c8[2] = '\0';
  local_1c8[3] = '\0';
  local_1c8[4] = '\0';
  local_1c8[5] = '\0';
  local_1c8[6] = '\0';
  local_1c8[7] = '\0';
  local_1c8[8] = '\0';
  local_1c8[9] = '\0';
  local_1c8[10] = '\0';
  local_1c8[0xb] = '\0';
  local_1c8[0xc] = '\0';
  local_1c8[0xd] = '\0';
  local_1c8[0xe] = '\0';
  local_1c8[0xf] = '\0';
  uVar7 = 0x7c;
  do {
    bVar3 = (byte)uVar7 & 0x3f;
    uVar10 = (uint)(uVar2 >> ((byte)uVar7 & 0x3f));
    if ((uVar7 & 0x40) == 0) {
      uVar10 = (uint)(uVar1 >> bVar3) | (uint)(uVar2 << 0x40 - bVar3);
    }
    cVar4 = (char)(uVar10 & 0xf);
    cVar9 = cVar4 + '0';
    if (9 < (uVar10 & 0xf)) {
      cVar9 = cVar4 + '7';
    }
    *pcVar8 = cVar9;
    uVar7 = uVar7 - 4;
    pcVar8 = pcVar8 + 1;
  } while (uVar7 != 0xfffffffffffffffc);
  local_1c8[0x20] = 0;
  local_208 = local_1f8;
  sVar6 = strlen(local_1c8);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,local_1c8,local_1c8 + sVar6);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_208,local_200);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
  if (local_208 != local_1f8) {
    operator_delete(local_208,local_1f8[0] + 1);
  }
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8,local_1d8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

inline void PrintToFloatingPoint(const floating_point<T>& f, iu_ostream* os)
{
    iu_stringstream ss;
#if IUTEST_HAS_IOMANIP
    ss << ::std::setprecision(::std::numeric_limits<T>::digits10 + 2);
#endif
    UniversalPrint(f.raw(), &ss);
    *os << ss.str() << "(0x" << ToHexString(f.bits()) << ")";
}